

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O3

type dlib::
     matrix_assign_default<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>>
               (assignable_ptr_matrix<float> *dest,
               matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
               *src,type alpha,bool add_to)

{
  undefined1 auVar1 [16];
  long lVar2;
  matrix_op<dlib::op_pointer_to_mat<float>_> *pmVar3;
  undefined7 in_register_00000011;
  op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
  *poVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  const_ret_type cVar8;
  undefined1 auVar9 [64];
  undefined1 extraout_var [60];
  
  if ((int)CONCAT71(in_register_00000011,add_to) == 0) {
    poVar4 = &((src->op).m)->op;
    pmVar3 = ((op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
               *)&poVar4->m1)->m1->lhs;
    lVar6 = (pmVar3->op).cols;
    if ((alpha != 1.0) || (NAN(alpha))) {
      if (0 < lVar6) {
        lVar6 = 0;
        lVar7 = 0;
        do {
          if (0 < (pmVar3->op).rows) {
            lVar5 = 0;
            do {
              cVar8 = op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                      ::apply(poVar4,lVar5,lVar7);
              *(float *)((long)dest->ptr + lVar5 * 4 + dest->width * lVar6) = cVar8 * alpha;
              lVar5 = lVar5 + 1;
              poVar4 = &((src->op).m)->op;
              pmVar3 = ((op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                         *)&poVar4->m1)->m1->lhs;
            } while (lVar5 < (pmVar3->op).rows);
          }
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + 4;
        } while (lVar7 < (pmVar3->op).cols);
      }
    }
    else if (0 < lVar6) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        if (0 < (pmVar3->op).rows) {
          lVar5 = 0;
          do {
            cVar8 = op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                    ::apply(poVar4,lVar5,lVar7);
            *(const_ret_type *)((long)dest->ptr + lVar5 * 4 + dest->width * lVar6) = cVar8;
            lVar5 = lVar5 + 1;
            poVar4 = &((src->op).m)->op;
            pmVar3 = ((op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                       *)&poVar4->m1)->m1->lhs;
          } while (lVar5 < (pmVar3->op).rows);
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 4;
      } while (lVar7 < (pmVar3->op).cols);
    }
  }
  else if ((alpha != 1.0) || (NAN(alpha))) {
    poVar4 = &((src->op).m)->op;
    pmVar3 = ((op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
               *)&poVar4->m1)->m1->lhs;
    lVar6 = (pmVar3->op).cols;
    if ((alpha != -1.0) || (NAN(alpha))) {
      if (0 < lVar6) {
        lVar6 = 0;
        lVar7 = 0;
        do {
          if (0 < (pmVar3->op).rows) {
            lVar5 = 0;
            do {
              auVar9._0_4_ = op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                             ::apply(poVar4,lVar5,lVar7);
              auVar9._4_60_ = extraout_var;
              lVar2 = dest->width * lVar6;
              auVar1 = vfmadd213ss_fma(auVar9._0_16_,ZEXT416((uint)alpha),
                                       ZEXT416(*(uint *)((long)dest->ptr + lVar5 * 4 + lVar2)));
              *(int *)((long)dest->ptr + lVar5 * 4 + lVar2) = auVar1._0_4_;
              lVar5 = lVar5 + 1;
              poVar4 = &((src->op).m)->op;
              pmVar3 = ((op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                         *)&poVar4->m1)->m1->lhs;
            } while (lVar5 < (pmVar3->op).rows);
          }
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + 4;
        } while (lVar7 < (pmVar3->op).cols);
      }
    }
    else if (0 < lVar6) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        if (0 < (pmVar3->op).rows) {
          lVar5 = 0;
          do {
            cVar8 = op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                    ::apply(poVar4,lVar5,lVar7);
            lVar2 = dest->width * lVar6;
            *(float *)((long)dest->ptr + lVar5 * 4 + lVar2) =
                 *(float *)((long)dest->ptr + lVar5 * 4 + lVar2) - cVar8;
            lVar5 = lVar5 + 1;
            poVar4 = &((src->op).m)->op;
            pmVar3 = ((op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                       *)&poVar4->m1)->m1->lhs;
          } while (lVar5 < (pmVar3->op).rows);
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 4;
      } while (lVar7 < (pmVar3->op).cols);
    }
  }
  else {
    poVar4 = &((src->op).m)->op;
    pmVar3 = ((op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
               *)&poVar4->m1)->m1->lhs;
    if (0 < (pmVar3->op).cols) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        if (0 < (pmVar3->op).rows) {
          lVar5 = 0;
          do {
            cVar8 = op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                    ::apply(poVar4,lVar5,lVar7);
            lVar2 = dest->width * lVar6;
            *(float *)((long)dest->ptr + lVar5 * 4 + lVar2) =
                 cVar8 + *(float *)((long)dest->ptr + lVar5 * 4 + lVar2);
            lVar5 = lVar5 + 1;
            poVar4 = &((src->op).m)->op;
            pmVar3 = ((op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                       *)&poVar4->m1)->m1->lhs;
          } while (lVar5 < (pmVar3->op).rows);
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 4;
      } while (lVar7 < (pmVar3->op).cols);
    }
  }
  return;
}

Assistant:

inline typename disable_if<ma::has_column_major_layout<EXP1> >::type  
    matrix_assign_default (
        EXP1& dest,
        const EXP2& src,
        typename EXP2::type alpha,
        bool add_to
    )
    /*!
        requires
            - src.destructively_aliases(dest) == false
            - dest.nr() == src.nr()
            - dest.nc() == src.nc()
        ensures
            - if (add_to == false) then
                - #dest == alpha*src
            - else
                - #dest == dest + alpha*src
    !*/
    {
        if (add_to)
        {
            if (alpha == static_cast<typename EXP2::type>(1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) += src(r,c);
                    }
                }
            }
            else if (alpha == static_cast<typename EXP2::type>(-1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) -= src(r,c);
                    }
                }
            }
            else
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) += alpha*src(r,c);
                    }
                }
            }
        }
        else
        {
            if (alpha == static_cast<typename EXP2::type>(1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) = src(r,c);
                    }
                }
            }
            else
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) = alpha*src(r,c);
                    }
                }
            }
        }
    }